

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

void * debug_realloc(void *ud,void *b,size_t oldsize,size_t size)

{
  undefined1 *puVar1;
  long *plVar2;
  long lVar3;
  char *__nptr;
  ulong uVar4;
  size_t *psVar5;
  int iVar6;
  Header_conflict *block;
  
  uVar4 = *(ulong *)((long)ud + 0x18);
  if (uVar4 == 0) {
    __nptr = getenv("MEMLIMIT");
    if (__nptr == (char *)0x0) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar4 = strtoul(__nptr,(char **)0x0,10);
    }
    *(ulong *)((long)ud + 0x18) = uVar4;
  }
  if (b == (void *)0x0) {
    block = (Header_conflict *)0x0;
    iVar6 = (int)oldsize;
    if (8 < oldsize) {
      iVar6 = 0;
    }
    oldsize = 0;
  }
  else {
    if (*(size_t *)((long)b + -0x10) != oldsize) {
      __assert_fail("oldsize == block->d.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x8f,"void *debug_realloc(void *, void *, size_t, size_t)");
    }
    iVar6 = *(int *)((long)b + -8);
    block = (Header_conflict *)((long)b + -0x10);
  }
  if (size == 0) {
    freeblock((Memcontrol *)ud,block);
  }
  else {
    lVar3 = *(long *)((long)ud + 0x20);
    if (size != oldsize && lVar3 != -1) {
      if (lVar3 == 0) {
        return (void *)0x0;
      }
      *(long *)((long)ud + 0x20) = lVar3 + -1;
    }
    if ((size < oldsize || size - oldsize == 0) ||
       ((size - oldsize) + *(long *)((long)ud + 8) <= uVar4)) {
      if (size <= oldsize) {
        oldsize = size;
      }
      if ((size < 0xffffffffffffffe0) &&
         (psVar5 = (size_t *)malloc(size + 0x20), psVar5 != (size_t *)0x0)) {
        if (block != (Header_conflict *)0x0) {
          memcpy(psVar5 + 2,block + 1,oldsize);
          freeblock((Memcontrol *)ud,block);
        }
        memset((void *)((long)psVar5 + oldsize + 0x10),0xab,size - oldsize);
        puVar1 = (undefined1 *)((long)psVar5 + size + 0x10);
        *puVar1 = 0x55;
        puVar1[1] = 0x55;
        puVar1[2] = 0x55;
        puVar1[3] = 0x55;
        puVar1[4] = 0x55;
        puVar1[5] = 0x55;
        puVar1[6] = 0x55;
        puVar1[7] = 0x55;
        puVar1[8] = 0x55;
        puVar1[9] = 0x55;
        puVar1[10] = 0x55;
        puVar1[0xb] = 0x55;
        puVar1[0xc] = 0x55;
        puVar1[0xd] = 0x55;
        puVar1[0xe] = 0x55;
        puVar1[0xf] = 0x55;
        *psVar5 = size;
        *(int *)(psVar5 + 1) = iVar6;
        uVar4 = size + *(long *)((long)ud + 8);
        *(ulong *)((long)ud + 8) = uVar4;
        if (*(ulong *)((long)ud + 0x10) < uVar4) {
          *(ulong *)((long)ud + 0x10) = uVar4;
        }
        *(long *)ud = *ud + 1;
        plVar2 = (long *)((long)ud + (long)iVar6 * 8 + 0x28);
        *plVar2 = *plVar2 + 1;
        return psVar5 + 2;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

LUA_API void *debug_realloc (void *ud, void *b, size_t oldsize, size_t size) {
  Memcontrol *mc = cast(Memcontrol *, ud);
  Header *block = cast(Header *, b);
  int type;
  if (mc->memlimit == 0) {  /* first time? */
    char *limit = getenv("MEMLIMIT");  /* initialize memory limit */
    mc->memlimit = limit ? strtoul(limit, NULL, 10) : ULONG_MAX;
  }
  if (block == NULL) {
    type = (oldsize < LUA_NUMTAGS) ? oldsize : 0;
    oldsize = 0;
  }
  else {
    block--;  /* go to real header */
    type = block->d.type;
    lua_assert(oldsize == block->d.size);
  }
  if (size == 0) {
    freeblock(mc, block);
    return NULL;
  }
  if (mc->countlimit != ~0UL && size != oldsize) {  /* count limit in use? */
    if (mc->countlimit == 0)
      return NULL;  /* fake a memory allocation error */
    mc->countlimit--;
  }
  if (size > oldsize && mc->total+size-oldsize > mc->memlimit)
    return NULL;  /* fake a memory allocation error */
  else {
    Header *newblock;
    int i;
    size_t commonsize = (oldsize < size) ? oldsize : size;
    size_t realsize = sizeof(Header) + size + MARKSIZE;
    if (realsize < size) return NULL;  /* arithmetic overflow! */
    newblock = cast(Header *, malloc(realsize));  /* alloc a new block */
    if (newblock == NULL)
      return NULL;  /* really out of memory? */
    if (block) {
      memcpy(newblock + 1, block + 1, commonsize);  /* copy old contents */
      freeblock(mc, block);  /* erase (and check) old copy */
    }
    /* initialize new part of the block with something weird */
    fillmem(cast_charp(newblock + 1) + commonsize, size - commonsize);
    /* initialize marks after block */
    for (i = 0; i < MARKSIZE; i++)
      *(cast_charp(newblock + 1) + size + i) = MARK;
    newblock->d.size = size;
    newblock->d.type = type;
    mc->total += size;
    if (mc->total > mc->maxmem)
      mc->maxmem = mc->total;
    mc->numblocks++;
    mc->objcount[type]++;
    return newblock + 1;
  }
}